

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp.c
# Opt level: O3

int readline(char *pl)

{
  ushort *puVar1;
  int iVar2;
  ushort **ppuVar3;
  uint uVar4;
  char *pcVar5;
  byte bVar6;
  char cVar7;
  char *pcVar8;
  ulong uVar9;
  
  if (c == -1) {
    return 0;
  }
  do {
    c = l;
    l = fgetc((FILE *)f);
    if (c < 9) {
      if (c == -1) {
        iVar2 = column;
        if (mlc == 1) {
          err(E,"unterminated comment");
          iVar2 = column;
        }
      }
      else {
LAB_0010654a:
        bVar6 = c == 0x2f & (mlc ^ 1) ^ 1;
        if (l == 0x2f && bVar6 == 0) {
          uVar4 = 0x2f;
          while ((0xd < uVar4 || (iVar2 = column, (0x2c00U >> (uVar4 & 0x1f) & 1) == 0))) {
            c = uVar4;
            uVar4 = fgetc((FILE *)f);
            l = uVar4;
          }
        }
        else if (l == 0x2a && bVar6 == 0) {
          c = 0x2a;
          l = fgetc((FILE *)f);
          pl[0] = ' ';
          pl[1] = ' ';
          pl = pl + 2;
          mlc = 1;
          iVar2 = column;
        }
        else if (((~mlc & 1) == 0 && c == 0x2a) && l == 0x2f) {
          c = 0x2f;
          l = fgetc((FILE *)f);
          pl[0] = ' ';
          pl[1] = ' ';
          pl = pl + 2;
          mlc = 0;
          eline = line;
          ecolumn = column;
          iVar2 = column;
        }
        else {
          iVar2 = column + 1;
          column = iVar2;
          if ((mlc & 1) == 0) {
            *pl = (char)c;
          }
          else {
            *pl = ' ';
          }
          pl = pl + 1;
        }
      }
    }
    else {
      if (c != 9) {
        if (c == 10) {
          iVar2 = 0xd;
          if (l == 0xd) {
LAB_001066a3:
            c = iVar2;
            l = fgetc((FILE *)f);
          }
        }
        else {
          if (c != 0xd) goto LAB_0010654a;
          iVar2 = 10;
          if (l == 10) goto LAB_001066a3;
        }
        *pl = '\n';
        pl = pl + 1;
        break;
      }
      uVar4 = column % tabstop;
      column = (tabstop - uVar4) + column;
      uVar9 = (ulong)(~uVar4 + tabstop);
      memset(pl,0x20,uVar9 + 1);
      pl = pl + uVar9 + 1;
      iVar2 = column;
    }
    if (0xfff < iVar2) {
      ccerr(F,"line too long in file \"%s\" at line %d",filnam,(ulong)(uint)line);
    }
  } while (c != -1);
  *pl = '\0';
  ppuVar3 = __ctype_b_loc();
  puVar1 = *ppuVar3;
  pcVar8 = &DAT_0010c80d;
  do {
    pcVar5 = pcVar8 + 3;
    pcVar8 = pcVar8 + 1;
  } while ((*(byte *)((long)puVar1 + (long)*pcVar5 * 2 + 1) & 0x20) != 0);
  if (*pcVar5 == '\0') {
    linebuf[0] = '\n';
    linebuf[1] = '\0';
  }
  else {
    do {
      pcVar5 = pcVar8;
      pcVar8 = pcVar5 + 1;
    } while (pcVar5[2] != '\0');
    cVar7 = *pcVar8;
    pcVar5 = pcVar5 + 2;
    if ((*(byte *)((long)puVar1 + (long)cVar7 * 2 + 1) & 0x20) != 0) {
      do {
        pcVar8 = pcVar5;
        column = column + -1;
        cVar7 = pcVar8[-2];
        pcVar5 = pcVar8 + -1;
      } while ((*(byte *)((long)puVar1 + (long)cVar7 * 2 + 1) & 0x20) != 0);
      pcVar8 = pcVar8 + -2;
    }
    if (cVar7 == '\\') {
      line = line + 1;
      readline(pcVar8);
      update_line = 1;
    }
    else {
      column = column + -1;
      pcVar5[0] = '\n';
      pcVar5[1] = '\0';
    }
  }
  return 1;
}

Assistant:

int readline(char* pl)
{
    if (c == EOF)
        return 0;

    while (c != EOF)
    {
        readbyte();

        if (c == EOF)
        {
            if (mlc)
                err(E, "unterminated comment");

        }
        else if (c == '\n')
        {
            if (l == '\r')
                readbyte();

            *pl++ = '\n';
            break;
        }
        else if (c == '\r')
        {
            if (l == '\n')
                readbyte();

            *pl++ = '\n';
            break;
        }
        else if (c == '\t')
        {
            int sp = tabstop - (column % tabstop);
            column += sp;
            while (sp--)
                *pl++ = ' ';
        }
        /*else if (c == '\v')
        {

        } */
        else if (!mlc && c == '/' && l == '/')
        {
            while (l != '\n' && l != '\r' && l != '\v')
                readbyte();
        }
        else if (!mlc && c == '/' && l == '*')
        {
            readbyte();
            *pl++ = ' ';
            *pl++ = ' ';
            mlc = 1;
        }
        else if (mlc && c == '*' && l == '/')
        {
            readbyte();
            *pl++ = ' ';
            *pl++ = ' ';
            mlc = 0;

            eline = line;
            ecolumn = column;
        }
        else
        {
            ++column;
            if (mlc)
                *pl++ = ' ';
            else
                *pl++ = c;
        }

        if (column >= BUFSIZE)
            ccerr(F, "line too long in file \"%s\" at line %d", filnam, line);
    }
    *pl = 0;
    
    pl = linebuf;
    while (isspace(*pl))
        pl++;
    
    /* empty line ? */
    if (!*pl)
    {
        linebuf[0] = '\n';
        linebuf[1] = 0;
        return 1;
    }
    
    /* search for the last non white character of the line */
    while (*pl)
        ++pl;
    --pl;
    
    while (isspace(*pl))
    {
        --pl;
        --column;
    }
    
    /* merge lines or remove trailing spaces */
    if (*pl == '\\')
    {
        ++line;
        readline(pl);
        update_line = 1;
    }
    else
    {
        --column;
        *++pl = '\n';
        *++pl = 0;
    }
    
    return 1;
}